

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::enumerateDeviceLayers(TestStatus *__return_storage_ptr__,Context *context)

{
  unsigned_long uVar1;
  qpTestResult code;
  TestContext *this;
  TestLog *log_00;
  InstanceInterface *vki;
  VkPhysicalDevice physicalDevice;
  size_type sVar2;
  MessageBuilder *pMVar3;
  const_reference pvVar4;
  string local_2b8;
  CheckIncompleteResult<vk::VkLayerProperties> local_298;
  allocator<char> local_281;
  value_type local_280;
  MessageBuilder local_260;
  unsigned_long local_e0;
  size_t ndx;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layerNames;
  vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> properties;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  ResultCollector results;
  TestLog *log;
  Context *context_local;
  
  this = Context::getTestContext(context);
  log_00 = tcu::TestContext::getLog(this);
  results.m_message.field_2._8_8_ = log_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_91);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_70,log_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  vki = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::enumerateDeviceLayerProperties
            ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)
             &layerNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,vki,physicalDevice);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&ndx);
  local_e0 = 0;
  while( true ) {
    uVar1 = local_e0;
    sVar2 = std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::size
                      ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)
                       &layerNames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar2 <= uVar1) break;
    tcu::TestLog::operator<<
              (&local_260,(TestLog *)results.m_message.field_2._8_8_,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_260,&local_e0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x134fa06);
    pvVar4 = std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::operator[]
                       ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)
                        &layerNames.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,local_e0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,pvVar4);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_260);
    pvVar4 = std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::operator[]
                       ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)
                        &layerNames.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,local_e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,pvVar4->layerName,&local_281);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ndx,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
    local_e0 = local_e0 + 1;
  }
  checkDuplicateLayers
            ((ResultCollector *)local_70,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ndx);
  local_298._vptr_CheckIncompleteResult = (_func_int **)0x0;
  local_298.m_count = 0;
  local_298.m_result = VK_SUCCESS;
  CheckEnumerateDeviceLayerPropertiesIncompleteResult::
  CheckEnumerateDeviceLayerPropertiesIncompleteResult
            ((CheckEnumerateDeviceLayerPropertiesIncompleteResult *)&local_298);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&ndx);
  CheckIncompleteResult<vk::VkLayerProperties>::operator()
            (&local_298,context,(ResultCollector *)local_70,sVar2);
  CheckEnumerateDeviceLayerPropertiesIncompleteResult::
  ~CheckEnumerateDeviceLayerPropertiesIncompleteResult
            ((CheckEnumerateDeviceLayerPropertiesIncompleteResult *)&local_298);
  code = tcu::ResultCollector::getResult((ResultCollector *)local_70);
  tcu::ResultCollector::getMessage_abi_cxx11_(&local_2b8,(ResultCollector *)local_70);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&ndx);
  std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::~vector
            ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)
             &layerNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_70);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus enumerateDeviceLayers (Context& context)
{
	TestLog&						log			= context.getTestContext().getLog();
	tcu::ResultCollector			results		(log);
	const vector<VkLayerProperties>	properties	= enumerateDeviceLayerProperties(context.getInstanceInterface(), context.getPhysicalDevice());
	vector<string>					layerNames;

	for (size_t ndx = 0; ndx < properties.size(); ndx++)
	{
		log << TestLog::Message << ndx << ": " << properties[ndx] << TestLog::EndMessage;

		layerNames.push_back(properties[ndx].layerName);
	}

	checkDuplicateLayers(results, layerNames);
	CheckEnumerateDeviceLayerPropertiesIncompleteResult()(context, results, layerNames.size());

	return tcu::TestStatus(results.getResult(), results.getMessage());
}